

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Arg * __thiscall fmt::internal::FormatterBase::next_arg(FormatterBase *this,char **error)

{
  int value;
  char **in_RDX;
  long in_RSI;
  Arg *in_RDI;
  FormatterBase *unaff_retaddr;
  
  if (*(int *)(in_RSI + 0x10) < 0) {
    *in_RDX = "cannot switch from manual to automatic argument indexing";
    memset(in_RDI,0,0x20);
  }
  else {
    value = *(int *)(in_RSI + 0x10);
    *(int *)(in_RSI + 0x10) = value + 1;
    to_unsigned<int>(value);
    do_get_arg(unaff_retaddr,(uint)((ulong)in_RSI >> 0x20),in_RDX);
  }
  return in_RDI;
}

Assistant:

Arg next_arg(const char *&error) {
    if (next_arg_index_ >= 0)
      return do_get_arg(internal::to_unsigned(next_arg_index_++), error);
    error = "cannot switch from manual to automatic argument indexing";
    return Arg();
  }